

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3FindInIndex(Parse *pParse,Expr *pX,u32 inFlags,int *prRhsHasNull,int *aiMap,int *piTab)

{
  undefined8 *puVar1;
  byte bVar2;
  short sVar3;
  ushort uVar4;
  u32 uVar5;
  ExprList *pEVar6;
  Select *pSVar7;
  SrcList *pSVar8;
  Table *pTab;
  Index *pIdx;
  char cVar9;
  bool bVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  Vdbe *p;
  Expr *pEVar15;
  Expr *pLeft;
  CollSeq *pCVar16;
  char aff2;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  int iCur;
  ulong uVar20;
  ExprList_item *pEVar21;
  Index **ppIVar22;
  ExprList_item *pEVar23;
  ulong local_60;
  
  p = sqlite3GetVdbe(pParse);
  iCur = pParse->nTab;
  pParse->nTab = iCur + 1;
  if (prRhsHasNull == (int *)0x0) {
    prRhsHasNull = (int *)0x0;
  }
  else if ((pX->flags & 0x1000) != 0) {
    pEVar6 = ((pX->x).pSelect)->pEList;
    uVar14 = pEVar6->nExpr;
    pEVar23 = pEVar6->a;
    uVar17 = 0;
    uVar20 = 0;
    if (0 < (int)uVar14) {
      uVar20 = (ulong)uVar14;
    }
    for (; uVar20 != uVar17; uVar17 = uVar17 + 1) {
      iVar11 = sqlite3ExprCanBeNull(pEVar23->pExpr);
      if (iVar11 != 0) {
        uVar20 = uVar17 & 0xffffffff;
        break;
      }
      pEVar23 = pEVar23 + 1;
    }
    if ((uint)uVar20 == uVar14) {
      prRhsHasNull = (int *)0x0;
    }
  }
  if ((((((pParse->nErr == 0) && ((pX->flags & 0x1040) == 0x1000)) &&
        (pSVar7 = (pX->x).pSelect, pSVar7->pPrior == (Select *)0x0)) &&
       (((pSVar7->selFlags & 9) == 0 && (pSVar7->pLimit == (Expr *)0x0)))) &&
      ((pSVar7->pWhere == (Expr *)0x0 &&
       ((pSVar8 = pSVar7->pSrc, pSVar8->nSrc == 1 && (pSVar8->a[0].pSelect == (Select *)0x0)))))) &&
     (pTab = pSVar8->a[0].pTab, pTab->eTabType != '\x01')) {
    uVar14 = pSVar7->pEList->nExpr;
    pEVar23 = pSVar7->pEList->a;
    uVar17 = 0;
    if (0 < (int)uVar14) {
      uVar17 = (ulong)uVar14;
    }
    lVar18 = 0;
LAB_0016455e:
    if (uVar17 * 0x18 + 0x18 != lVar18 + 0x18) goto code_r0x00164567;
    if (pSVar7 != (Select *)0x0) {
      iVar11 = sqlite3SchemaToIndex(pParse->db,pTab->pSchema);
      sqlite3CodeVerifySchema(pParse,iVar11);
      sqlite3TableLock(pParse,iVar11,pTab->tnum,'\0',pTab->zName);
      if ((uVar14 != 1) || (-1 < pEVar23->pExpr->iColumn)) {
        bVar10 = true;
        lVar18 = 0;
        pEVar21 = pEVar23;
        while ((lVar18 < (int)uVar14 && (bVar10))) {
          pEVar15 = sqlite3VectorFieldSubexpr(pX->pLeft,(int)lVar18);
          sVar3 = pEVar21->pExpr->iColumn;
          aff2 = 'D';
          if ((-1 < (long)sVar3) && (sVar3 < pTab->nCol)) {
            aff2 = pTab->aCol[sVar3].affinity;
          }
          cVar9 = sqlite3CompareAffinity(pEVar15,aff2);
          bVar10 = 'B' < aff2 || (byte)(cVar9 + 0xbfU) < 2;
          lVar18 = lVar18 + 1;
          pEVar21 = pEVar21 + 1;
        }
        if (bVar10) {
          ppIVar22 = &pTab->pIndex;
          iVar13 = 0;
          while ((pIdx = *ppIVar22, pIdx != (Index *)0x0 && (iVar13 == 0))) {
            uVar4 = pIdx->nColumn;
            iVar13 = 0;
            iVar12 = 0;
            if ((((int)uVar14 <= (int)(uint)uVar4) &&
                ((uVar4 < 0x3f && (pIdx->pPartIdxWhere == (Expr *)0x0)))) &&
               ((iVar13 = iVar12, (inFlags & 4) == 0 ||
                (((int)(uint)pIdx->nKeyCol <= (int)uVar14 &&
                 ((uVar4 <= uVar14 || (pIdx->onError != '\0')))))))) {
              local_60 = 0;
              for (uVar20 = 0; uVar20 != uVar17; uVar20 = uVar20 + 1) {
                pLeft = sqlite3VectorFieldSubexpr(pX->pLeft,(int)uVar20);
                pEVar15 = pEVar23[uVar20].pExpr;
                pCVar16 = sqlite3BinaryCompareCollSeq(pParse,pLeft,pEVar15);
                uVar19 = 0;
                while( true ) {
                  if (uVar14 == uVar19) goto LAB_0016479b;
                  if ((pIdx->aiColumn[uVar19] == pEVar15->iColumn) &&
                     ((pCVar16 == (CollSeq *)0x0 ||
                      (iVar12 = sqlite3StrICmp(pCVar16->zName,pIdx->azColl[uVar19]), iVar12 == 0))))
                  break;
                  uVar19 = uVar19 + 1;
                }
                if ((uVar14 == (uint)uVar19) || ((local_60 >> (uVar19 & 0x3f) & 1) != 0)) break;
                if (aiMap != (int *)0x0) {
                  aiMap[uVar20] = (uint)uVar19;
                }
                local_60 = local_60 | 1L << ((byte)uVar19 & 0x3f);
              }
LAB_0016479b:
              if ((local_60 ^ -1L << ((byte)uVar14 & 0x3f)) == 0xffffffffffffffff) {
                iVar13 = sqlite3VdbeAddOp0(p,0xe);
                sqlite3VdbeExplain(pParse,'\0',"USING INDEX %s FOR IN-OPERATOR",pIdx->zName);
                sqlite3VdbeAddOp3(p,0x70,iCur,pIdx->tnum,iVar11);
                sqlite3VdbeSetP4KeyInfo(pParse,pIdx);
                bVar2 = *pIdx->aSortOrder;
                if (prRhsHasNull != (int *)0x0) {
                  iVar12 = pParse->nMem + 1;
                  pParse->nMem = iVar12;
                  *prRhsHasNull = iVar12;
                  if (uVar14 == 1) {
                    sqlite3SetHasNullFlag(p,iCur,iVar12);
                  }
                }
                sqlite3VdbeJumpHere(p,iVar13);
                iVar13 = bVar2 + 3;
              }
            }
            ppIVar22 = &pIdx->pNext;
          }
          if (iVar13 != 0) goto LAB_0016493b;
        }
        goto LAB_00164892;
      }
      iVar13 = sqlite3VdbeAddOp0(p,0xe);
      sqlite3OpenTable(pParse,iCur,iVar11,pTab,0x70);
      sqlite3VdbeExplain(pParse,'\0',"USING ROWID SEARCH ON TABLE %s FOR IN-OPERATOR");
      sqlite3VdbeJumpHere(p,iVar13);
      iVar13 = 1;
      goto LAB_0016493b;
    }
  }
LAB_00164892:
  if (((inFlags & 1) != 0) && ((pX->flags & 0x1000) == 0)) {
    pEVar15 = pX->pLeft;
    pX->pLeft = (Expr *)0x0;
    iVar11 = sqlite3ExprIsConstant(pX);
    pX->pLeft = pEVar15;
    if ((iVar11 == 0) || (((pX->x).pList)->nExpr < 3)) {
      pParse->nTab = pParse->nTab + -1;
      iVar13 = 5;
      iCur = -1;
      goto LAB_0016493b;
    }
  }
  uVar5 = pParse->nQueryLoop;
  if ((inFlags & 4) == 0) {
    if (prRhsHasNull == (int *)0x0) {
      iVar11 = 0;
    }
    else {
      iVar11 = pParse->nMem + 1;
      pParse->nMem = iVar11;
      *prRhsHasNull = iVar11;
    }
  }
  else {
    pParse->nQueryLoop = 0;
    iVar11 = 0;
  }
  sqlite3CodeRhsOfIN(pParse,pX,iCur);
  if (iVar11 != 0) {
    sqlite3SetHasNullFlag(p,iCur,iVar11);
  }
  pParse->nQueryLoop = uVar5;
  iVar13 = 2;
LAB_0016493b:
  if ((aiMap != (int *)0x0) && (iVar13 - 5U < 0xfffffffe)) {
    uVar14 = sqlite3ExprVectorSize(pX->pLeft);
    uVar20 = 0;
    uVar17 = (ulong)uVar14;
    if ((int)uVar14 < 1) {
      uVar17 = uVar20;
    }
    for (; uVar17 != uVar20; uVar20 = uVar20 + 1) {
      aiMap[uVar20] = (int)uVar20;
    }
  }
  *piTab = iCur;
  return iVar13;
code_r0x00164567:
  puVar1 = (undefined8 *)((long)&pEVar23->pExpr + lVar18);
  lVar18 = lVar18 + 0x18;
  if (*(char *)*puVar1 != -0x59) goto LAB_00164892;
  goto LAB_0016455e;
}

Assistant:

SQLITE_PRIVATE int sqlite3FindInIndex(
  Parse *pParse,             /* Parsing context */
  Expr *pX,                  /* The IN expression */
  u32 inFlags,               /* IN_INDEX_LOOP, _MEMBERSHIP, and/or _NOOP_OK */
  int *prRhsHasNull,         /* Register holding NULL status.  See notes */
  int *aiMap,                /* Mapping from Index fields to RHS fields */
  int *piTab                 /* OUT: index to use */
){
  Select *p;                            /* SELECT to the right of IN operator */
  int eType = 0;                        /* Type of RHS table. IN_INDEX_* */
  int iTab;                             /* Cursor of the RHS table */
  int mustBeUnique;                     /* True if RHS must be unique */
  Vdbe *v = sqlite3GetVdbe(pParse);     /* Virtual machine being coded */

  assert( pX->op==TK_IN );
  mustBeUnique = (inFlags & IN_INDEX_LOOP)!=0;
  iTab = pParse->nTab++;

  /* If the RHS of this IN(...) operator is a SELECT, and if it matters
  ** whether or not the SELECT result contains NULL values, check whether
  ** or not NULL is actually possible (it may not be, for example, due
  ** to NOT NULL constraints in the schema). If no NULL values are possible,
  ** set prRhsHasNull to 0 before continuing.  */
  if( prRhsHasNull && ExprUseXSelect(pX) ){
    int i;
    ExprList *pEList = pX->x.pSelect->pEList;
    for(i=0; i<pEList->nExpr; i++){
      if( sqlite3ExprCanBeNull(pEList->a[i].pExpr) ) break;
    }
    if( i==pEList->nExpr ){
      prRhsHasNull = 0;
    }
  }

  /* Check to see if an existing table or index can be used to
  ** satisfy the query.  This is preferable to generating a new
  ** ephemeral table.  */
  if( pParse->nErr==0 && (p = isCandidateForInOpt(pX))!=0 ){
    sqlite3 *db = pParse->db;              /* Database connection */
    Table *pTab;                           /* Table <table>. */
    int iDb;                               /* Database idx for pTab */
    ExprList *pEList = p->pEList;
    int nExpr = pEList->nExpr;

    assert( p->pEList!=0 );             /* Because of isCandidateForInOpt(p) */
    assert( p->pEList->a[0].pExpr!=0 ); /* Because of isCandidateForInOpt(p) */
    assert( p->pSrc!=0 );               /* Because of isCandidateForInOpt(p) */
    pTab = p->pSrc->a[0].pTab;

    /* Code an OP_Transaction and OP_TableLock for <table>. */
    iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
    assert( iDb>=0 && iDb<SQLITE_MAX_DB );
    sqlite3CodeVerifySchema(pParse, iDb);
    sqlite3TableLock(pParse, iDb, pTab->tnum, 0, pTab->zName);

    assert(v);  /* sqlite3GetVdbe() has always been previously called */
    if( nExpr==1 && pEList->a[0].pExpr->iColumn<0 ){
      /* The "x IN (SELECT rowid FROM table)" case */
      int iAddr = sqlite3VdbeAddOp0(v, OP_Once);
      VdbeCoverage(v);

      sqlite3OpenTable(pParse, iTab, iDb, pTab, OP_OpenRead);
      eType = IN_INDEX_ROWID;
      ExplainQueryPlan((pParse, 0,
            "USING ROWID SEARCH ON TABLE %s FOR IN-OPERATOR",pTab->zName));
      sqlite3VdbeJumpHere(v, iAddr);
    }else{
      Index *pIdx;                         /* Iterator variable */
      int affinity_ok = 1;
      int i;

      /* Check that the affinity that will be used to perform each
      ** comparison is the same as the affinity of each column in table
      ** on the RHS of the IN operator.  If it not, it is not possible to
      ** use any index of the RHS table.  */
      for(i=0; i<nExpr && affinity_ok; i++){
        Expr *pLhs = sqlite3VectorFieldSubexpr(pX->pLeft, i);
        int iCol = pEList->a[i].pExpr->iColumn;
        char idxaff = sqlite3TableColumnAffinity(pTab,iCol); /* RHS table */
        char cmpaff = sqlite3CompareAffinity(pLhs, idxaff);
        testcase( cmpaff==SQLITE_AFF_BLOB );
        testcase( cmpaff==SQLITE_AFF_TEXT );
        switch( cmpaff ){
          case SQLITE_AFF_BLOB:
            break;
          case SQLITE_AFF_TEXT:
            /* sqlite3CompareAffinity() only returns TEXT if one side or the
            ** other has no affinity and the other side is TEXT.  Hence,
            ** the only way for cmpaff to be TEXT is for idxaff to be TEXT
            ** and for the term on the LHS of the IN to have no affinity. */
            assert( idxaff==SQLITE_AFF_TEXT );
            break;
          default:
            affinity_ok = sqlite3IsNumericAffinity(idxaff);
        }
      }

      if( affinity_ok ){
        /* Search for an existing index that will work for this IN operator */
        for(pIdx=pTab->pIndex; pIdx && eType==0; pIdx=pIdx->pNext){
          Bitmask colUsed;      /* Columns of the index used */
          Bitmask mCol;         /* Mask for the current column */
          if( pIdx->nColumn<nExpr ) continue;
          if( pIdx->pPartIdxWhere!=0 ) continue;
          /* Maximum nColumn is BMS-2, not BMS-1, so that we can compute
          ** BITMASK(nExpr) without overflowing */
          testcase( pIdx->nColumn==BMS-2 );
          testcase( pIdx->nColumn==BMS-1 );
          if( pIdx->nColumn>=BMS-1 ) continue;
          if( mustBeUnique ){
            if( pIdx->nKeyCol>nExpr
             ||(pIdx->nColumn>nExpr && !IsUniqueIndex(pIdx))
            ){
              continue;  /* This index is not unique over the IN RHS columns */
            }
          }

          colUsed = 0;   /* Columns of index used so far */
          for(i=0; i<nExpr; i++){
            Expr *pLhs = sqlite3VectorFieldSubexpr(pX->pLeft, i);
            Expr *pRhs = pEList->a[i].pExpr;
            CollSeq *pReq = sqlite3BinaryCompareCollSeq(pParse, pLhs, pRhs);
            int j;

            assert( pReq!=0 || pRhs->iColumn==XN_ROWID || pParse->nErr );
            for(j=0; j<nExpr; j++){
              if( pIdx->aiColumn[j]!=pRhs->iColumn ) continue;
              assert( pIdx->azColl[j] );
              if( pReq!=0 && sqlite3StrICmp(pReq->zName, pIdx->azColl[j])!=0 ){
                continue;
              }
              break;
            }
            if( j==nExpr ) break;
            mCol = MASKBIT(j);
            if( mCol & colUsed ) break; /* Each column used only once */
            colUsed |= mCol;
            if( aiMap ) aiMap[i] = j;
          }

          assert( i==nExpr || colUsed!=(MASKBIT(nExpr)-1) );
          if( colUsed==(MASKBIT(nExpr)-1) ){
            /* If we reach this point, that means the index pIdx is usable */
            int iAddr = sqlite3VdbeAddOp0(v, OP_Once); VdbeCoverage(v);
            ExplainQueryPlan((pParse, 0,
                              "USING INDEX %s FOR IN-OPERATOR",pIdx->zName));
            sqlite3VdbeAddOp3(v, OP_OpenRead, iTab, pIdx->tnum, iDb);
            sqlite3VdbeSetP4KeyInfo(pParse, pIdx);
            VdbeComment((v, "%s", pIdx->zName));
            assert( IN_INDEX_INDEX_DESC == IN_INDEX_INDEX_ASC+1 );
            eType = IN_INDEX_INDEX_ASC + pIdx->aSortOrder[0];

            if( prRhsHasNull ){
#ifdef SQLITE_ENABLE_COLUMN_USED_MASK
              i64 mask = (1<<nExpr)-1;
              sqlite3VdbeAddOp4Dup8(v, OP_ColumnsUsed,
                  iTab, 0, 0, (u8*)&mask, P4_INT64);
#endif
              *prRhsHasNull = ++pParse->nMem;
              if( nExpr==1 ){
                sqlite3SetHasNullFlag(v, iTab, *prRhsHasNull);
              }
            }
            sqlite3VdbeJumpHere(v, iAddr);
          }
        } /* End loop over indexes */
      } /* End if( affinity_ok ) */
    } /* End if not an rowid index */
  } /* End attempt to optimize using an index */

  /* If no preexisting index is available for the IN clause
  ** and IN_INDEX_NOOP is an allowed reply
  ** and the RHS of the IN operator is a list, not a subquery
  ** and the RHS is not constant or has two or fewer terms,
  ** then it is not worth creating an ephemeral table to evaluate
  ** the IN operator so return IN_INDEX_NOOP.
  */
  if( eType==0
   && (inFlags & IN_INDEX_NOOP_OK)
   && ExprUseXList(pX)
   && (!sqlite3InRhsIsConstant(pX) || pX->x.pList->nExpr<=2)
  ){
    pParse->nTab--;  /* Back out the allocation of the unused cursor */
    iTab = -1;       /* Cursor is not allocated */
    eType = IN_INDEX_NOOP;
  }

  if( eType==0 ){
    /* Could not find an existing table or index to use as the RHS b-tree.
    ** We will have to generate an ephemeral table to do the job.
    */
    u32 savedNQueryLoop = pParse->nQueryLoop;
    int rMayHaveNull = 0;
    eType = IN_INDEX_EPH;
    if( inFlags & IN_INDEX_LOOP ){
      pParse->nQueryLoop = 0;
    }else if( prRhsHasNull ){
      *prRhsHasNull = rMayHaveNull = ++pParse->nMem;
    }
    assert( pX->op==TK_IN );
    sqlite3CodeRhsOfIN(pParse, pX, iTab);
    if( rMayHaveNull ){
      sqlite3SetHasNullFlag(v, iTab, rMayHaveNull);
    }
    pParse->nQueryLoop = savedNQueryLoop;
  }

  if( aiMap && eType!=IN_INDEX_INDEX_ASC && eType!=IN_INDEX_INDEX_DESC ){
    int i, n;
    n = sqlite3ExprVectorSize(pX->pLeft);
    for(i=0; i<n; i++) aiMap[i] = i;
  }
  *piTab = iTab;
  return eType;
}